

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O0

void __thiscall
wasm::BinaryenIRWriter<wasm::StackIRGenerator>::visitTry
          (BinaryenIRWriter<wasm::StackIRGenerator> *this,Try *curr)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Expression **ppEVar4;
  BasicType local_20;
  uint local_1c;
  Try *pTStack_18;
  Index i;
  Try *curr_local;
  BinaryenIRWriter<wasm::StackIRGenerator> *this_local;
  
  pTStack_18 = curr;
  curr_local = (Try *)this;
  emit(this,(Expression *)curr);
  visitPossibleBlockContents(this,pTStack_18->body);
  for (local_1c = 0; uVar2 = (ulong)local_1c,
      sVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pTStack_18->catchTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>), uVar2 < sVar3
      ; local_1c = local_1c + 1) {
    emitCatch(this,pTStack_18,local_1c);
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(pTStack_18->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)local_1c);
    visitPossibleBlockContents(this,*ppEVar4);
  }
  bVar1 = Try::hasCatchAll(pTStack_18);
  if (bVar1) {
    emitCatchAll(this,pTStack_18);
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        (&(pTStack_18->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    visitPossibleBlockContents(this,*ppEVar4);
  }
  bVar1 = Try::isDelegate(pTStack_18);
  if (bVar1) {
    emitDelegate(this,pTStack_18);
  }
  else {
    emitScopeEnd(this,(Expression *)pTStack_18);
  }
  local_20 = unreachable;
  bVar1 = wasm::Type::operator==
                    (&(pTStack_18->super_SpecificExpression<(wasm::Expression::Id)52>).
                      super_Expression.type,&local_20);
  if (bVar1) {
    emitUnreachable(this);
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitTry(Try* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->body);
  for (Index i = 0; i < curr->catchTags.size(); i++) {
    emitCatch(curr, i);
    visitPossibleBlockContents(curr->catchBodies[i]);
  }
  if (curr->hasCatchAll()) {
    emitCatchAll(curr);
    visitPossibleBlockContents(curr->catchBodies.back());
  }
  if (curr->isDelegate()) {
    emitDelegate(curr);
    // Note that when we emit a delegate we do not need to also emit a scope
    // ending, as the delegate ends the scope.
  } else {
    emitScopeEnd(curr);
  }
  if (curr->type == Type::unreachable) {
    emitUnreachable();
  }
}